

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::str_format_internal::FILERawSink::Write(FILERawSink *this,string_view v)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  size_t sVar4;
  char *__ptr;
  size_t __n;
  
  __ptr = v._M_str;
  __n = v._M_len;
LAB_0028cb2a:
  if ((__n == 0) || (this->error_ != 0)) {
    return;
  }
  piVar3 = __errno_location();
  iVar1 = *piVar3;
  *piVar3 = 0;
  sVar4 = fwrite(__ptr,1,__n,(FILE *)this->output_);
  if (sVar4 == 0) goto code_r0x0028cb59;
  this->count_ = this->count_ + sVar4;
  __ptr = __ptr + sVar4;
  __n = __n - sVar4;
  goto LAB_0028cb8c;
code_r0x0028cb59:
  iVar2 = *piVar3;
  if (iVar2 == 4) goto LAB_0028cb2a;
  if (iVar2 == 0) {
    iVar2 = ferror((FILE *)this->output_);
    if (iVar2 == 0) goto LAB_0028cb93;
    this->error_ = 9;
  }
  else {
    this->error_ = iVar2;
  }
LAB_0028cb8c:
  if (*piVar3 != 0) goto LAB_0028cb2a;
LAB_0028cb93:
  *piVar3 = iVar1;
  goto LAB_0028cb2a;
}

Assistant:

void FILERawSink::Write(string_view v) {
  while (!v.empty() && !error_) {
    // Reset errno to zero in case the libc implementation doesn't set errno
    // when a failure occurs.
    ClearErrnoGuard guard;

    if (size_t result = std::fwrite(v.data(), 1, v.size(), output_)) {
      // Some progress was made.
      count_ += result;
      v.remove_prefix(result);
    } else {
      if (errno == EINTR) {
        continue;
      } else if (errno) {
        error_ = errno;
      } else if (std::ferror(output_)) {
        // Non-POSIX compliant libc implementations may not set errno, so we
        // have check the streams error indicator.
        error_ = EBADF;
      } else {
        // We're likely on a non-POSIX system that encountered EINTR but had no
        // way of reporting it.
        continue;
      }
    }
  }
}